

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrbuf.cpp
# Opt level: O1

int __thiscall
CVmObjStringBuffer::getp_len(CVmObjStringBuffer *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  vm_obj_id_t vVar1;
  int iVar2;
  
  if (getp_len(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_len();
  }
  iVar2 = CVmObject::get_prop_check_argc(retval,argc,&getp_len::desc);
  if (iVar2 == 0) {
    vVar1 = *(vm_obj_id_t *)(this->super_CVmObject).ext_;
    retval->typ = VM_INT;
    (retval->val).obj = vVar1;
  }
  return 1;
}

Assistant:

int CVmObjStringBuffer::getp_len(VMG_ vm_obj_id_t self,
                                 vm_val_t *retval, uint *argc)
{
    /* check arguments */
    static CVmNativeCodeDesc desc(0);
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* return the content length */
    retval->set_int(get_ext()->len);

    /* handled */
    return TRUE;
}